

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

MPP_RET mpp_buffer_group_reset(MppBufferGroupImpl *p)

{
  list_head *plVar1;
  MPP_RET MVar2;
  list_head *plVar3;
  
  if (p == (MppBufferGroupImpl *)0x0) {
    _mpp_log_l(2,"mpp_buffer","found NULL pointer\n","mpp_buffer_group_reset");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)mpp_buffer_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_group_reset");
    }
    pthread_mutex_lock((pthread_mutex_t *)&p->buf_lock);
    buf_grp_add_log(p,GRP_RESET,(char *)0x0);
    plVar3 = (p->list_used).next;
    if (plVar3 != &p->list_used) {
      while (plVar3 != &p->list_used) {
        plVar1 = plVar3->next;
        buf_add_log((MppBufferImpl *)&plVar3[-0xd].prev,BUF_DISCARD,(char *)0x0);
        *(undefined4 *)((long)&plVar3[-1].next + 4) = 1;
        plVar3 = plVar1;
      }
    }
    plVar3 = (p->list_unused).next;
    if (plVar3 != &p->list_unused) {
      while (plVar3 != &p->list_unused) {
        plVar1 = plVar3->next;
        put_buffer(p,(MppBufferImpl *)&plVar3[-0xd].prev,0,"mpp_buffer_group_reset");
        plVar3 = plVar1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&p->buf_lock);
    MVar2 = MPP_OK;
    if (((byte)mpp_buffer_debug & 1) != 0) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_group_reset");
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_buffer_group_reset(MppBufferGroupImpl *p)
{
    if (NULL == p) {
        mpp_err_f("found NULL pointer\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_BUF_FUNCTION_ENTER();

    pthread_mutex_lock(&p->buf_lock);

    buf_grp_add_log(p, GRP_RESET, NULL);

    if (!list_empty(&p->list_used)) {
        MppBufferImpl *pos, *n;

        list_for_each_entry_safe(pos, n, &p->list_used, MppBufferImpl, list_status) {
            buf_add_log(pos, BUF_DISCARD, NULL);
            pos->discard = 1;
        }
    }

    // remove unused list
    if (!list_empty(&p->list_unused)) {
        MppBufferImpl *pos, *n;
        list_for_each_entry_safe(pos, n, &p->list_unused, MppBufferImpl, list_status) {
            put_buffer(p, pos, 0, __FUNCTION__);
        }
    }

    pthread_mutex_unlock(&p->buf_lock);

    MPP_BUF_FUNCTION_LEAVE();
    return MPP_OK;
}